

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSNet.h
# Opt level: O2

int recvuntilstr(SOCKET sock,char *recvbuf,char *endstr,int maxrecvbuflen,int *pBytesReceived)

{
  int iVar1;
  char *pcVar2;
  ssize_t sVar3;
  int iVar4;
  ulong uVar5;
  
  uVar5 = 0;
  do {
    iVar4 = (int)uVar5;
    if ((0 < iVar4) && (pcVar2 = strstr(recvbuf,endstr), pcVar2 != (char *)0x0)) {
      iVar1 = 0;
      goto LAB_001484f2;
    }
    if (maxrecvbuflen <= iVar4) {
      iVar1 = 6;
      goto LAB_001484f2;
    }
    sVar3 = recv(sock,recvbuf + uVar5,1,0);
    iVar1 = (int)sVar3;
    if (iVar1 < 0) {
      iVar1 = 1;
      goto LAB_001484f2;
    }
    uVar5 = (ulong)(uint)(iVar1 + iVar4);
  } while (iVar1 != 0);
  iVar1 = 2;
LAB_001484f2:
  *pBytesReceived = iVar4;
  return iVar1;
}

Assistant:

inline int recvuntilstr(SOCKET sock, char* recvbuf, char* endstr, int maxrecvbuflen, int* pBytesReceived)
{
	int BytesReceived = 0;
	int Bytes = 0;

	// Receive byte per byte.
	while ((BytesReceived <= 0)||(strstr(recvbuf, endstr) == NULL))
	{
		if (BytesReceived >= maxrecvbuflen)
		{
			PRINT_DEBUG_ERROR_OSNET(("recvuntilstr error (%s) : %s(sock=%d, recvbuf=%#x, endstr=%s, maxrecvbuflen=%d)\n", 
				strtime_m(), 
				"recvbuf full. ", 
				(int)sock, recvbuf, endstr, maxrecvbuflen));
			PRINT_DEBUG_MESSAGE_OSNET(("Total bytes received : %d\n", BytesReceived));
			*pBytesReceived = BytesReceived;
			return EXIT_OUT_OF_MEMORY;
		}

		// Receive 1 byte.
		Bytes = recv(sock, recvbuf + BytesReceived, 1, 0);
		if (Bytes >= 0)
		{
			if (Bytes == 0)
			{
				PRINT_DEBUG_WARNING_OSNET(("recvuntilstr warning (%s) : %s(sock=%d, recvbuf=%#x, endstr=%s, maxrecvbuflen=%d)\n", 
					strtime_m(), 
					szOSUtilsErrMsgs[EXIT_TIMEOUT], 
					(int)sock, recvbuf, endstr, maxrecvbuflen));
				PRINT_DEBUG_MESSAGE_OSNET(("Total bytes received : %d\n", BytesReceived));
				*pBytesReceived = BytesReceived;
				return EXIT_TIMEOUT;
			}
			else
			{
				PRINT_DEBUG_MESSAGE_OSNET(("Bytes received : %d\n", Bytes));
			}
		}
		else
		{
			PRINT_DEBUG_ERROR_OSNET(("recvuntilstr error (%s) : %s(sock=%d, recvbuf=%#x, endstr=%s, maxrecvbuflen=%d)\n", 
				strtime_m(), 
				WSAGetLastErrorMsg(), 
				(int)sock, recvbuf, endstr, maxrecvbuflen));
			PRINT_DEBUG_MESSAGE_OSNET(("Total bytes received : %d\n", BytesReceived));
			*pBytesReceived = BytesReceived;
			return EXIT_FAILURE;
		}

		BytesReceived += Bytes;
	}

	PRINT_DEBUG_MESSAGE_OSNET(("Total bytes received : %d\n", BytesReceived));

	*pBytesReceived = BytesReceived;

	return EXIT_SUCCESS;
}